

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O3

void Cmd_gc(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Usage: gc stop|now|full|pause [size]|stepmul [size]\n");
    return;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  iVar1 = strcasecmp(pcVar3,"stop");
  if (iVar1 == 0) {
    GC::Threshold = 0xfffffffffffffffd;
  }
  else {
    pcVar3 = FCommandLine::operator[](argv,1);
    iVar1 = strcasecmp(pcVar3,"now");
    if (iVar1 == 0) {
      GC::Threshold = GC::AllocBytes;
    }
    else {
      pcVar3 = FCommandLine::operator[](argv,1);
      iVar1 = strcasecmp(pcVar3,"full");
      if (iVar1 == 0) {
        GC::FullGC();
        return;
      }
      pcVar3 = FCommandLine::operator[](argv,1);
      iVar1 = strcasecmp(pcVar3,"pause");
      if (iVar1 == 0) {
        iVar1 = FCommandLine::argc(argv);
        if (iVar1 == 2) {
          pcVar3 = "Current GC pause is %d\n";
          uVar2 = GC::Pause;
LAB_00379855:
          Printf(pcVar3,(ulong)uVar2);
          return;
        }
        pcVar3 = FCommandLine::operator[](argv,2);
        uVar2 = atoi(pcVar3);
        GC::Pause = 1;
        if (1 < (int)uVar2) {
          GC::Pause = uVar2;
        }
      }
      else {
        pcVar3 = FCommandLine::operator[](argv,1);
        iVar1 = strcasecmp(pcVar3,"stepmul");
        if (iVar1 == 0) {
          iVar1 = FCommandLine::argc(argv);
          if (iVar1 == 2) {
            pcVar3 = "Current GC stepmul is %d\n";
            uVar2 = GC::StepMul;
            goto LAB_00379855;
          }
          pcVar3 = FCommandLine::operator[](argv,2);
          uVar2 = atoi(pcVar3);
          GC::StepMul = 100;
          if (100 < (int)uVar2) {
            GC::StepMul = uVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

CCMD(gc)
{
	if (argv.argc() == 1)
	{
		Printf ("Usage: gc stop|now|full|pause [size]|stepmul [size]\n");
		return;
	}
	if (stricmp(argv[1], "stop") == 0)
	{
		GC::Threshold = ~(size_t)0 - 2;
	}
	else if (stricmp(argv[1], "now") == 0)
	{
		GC::Threshold = GC::AllocBytes;
	}
	else if (stricmp(argv[1], "full") == 0)
	{
		GC::FullGC();
	}
	else if (stricmp(argv[1], "pause") == 0)
	{
		if (argv.argc() == 2)
		{
			Printf ("Current GC pause is %d\n", GC::Pause);
		}
		else
		{
			GC::Pause = MAX(1,atoi(argv[2]));
		}
	}
	else if (stricmp(argv[1], "stepmul") == 0)
	{
		if (argv.argc() == 2)
		{
			Printf ("Current GC stepmul is %d\n", GC::StepMul);
		}
		else
		{
			GC::StepMul = MAX(100, atoi(argv[2]));
		}
	}
}